

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O2

void __thiscall Pubkey_TweakTest_Test::~Pubkey_TweakTest_Test(Pubkey_TweakTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Pubkey, TweakTest) {
  ByteData256 tweak1("bd7d5d628f259c5f141519a932fb97e57e03852fd6fc5c42f41eee3df2a09e3a");
  ByteData256 tweak2("dc66de3b954578f60b68ab5d241c98b24c0b91038d1b5b158a63fbafa7cc9073");
  std::string exp_pk_t23 = "03ffcfb532fc3131cec229b3be66a1c0b4808b0d0a84468cd0c39caa88aa8a8d58";

  Pubkey pk_a("034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_b("03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");

  Pubkey pk_t11 = pk_a + tweak1;
  Pubkey pk_t12 = pk_b;
  pk_t12 += tweak2;
  Pubkey pk_t13 = pk_a * tweak1;

  Pubkey pk_t21 = pk_t11 - tweak1;
  Pubkey pk_t22 = pk_t12;
  pk_t22 -= tweak2;
  Pubkey pk_t23 = pk_t13;
  pk_t23 *= tweak1;

  EXPECT_EQ(pk_a.GetHex(), pk_t21.GetHex());
  EXPECT_EQ(pk_b.GetHex(), pk_t22.GetHex());
  EXPECT_EQ(exp_pk_t23, pk_t23.GetHex());
}